

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_parity_uint64_128_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  word *pwVar1;
  word *pwVar2;
  word *pwVar3;
  word *pwVar4;
  ulong uVar5;
  block_t *vblock;
  ulong uVar6;
  
  uVar5 = 0;
  for (uVar6 = 0x22; uVar6 != 0x40; uVar6 = uVar6 + 2) {
    pwVar1 = At->w64;
    pwVar2 = At->w64;
    pwVar3 = At->w64;
    pwVar4 = At->w64;
    At = At + 1;
    uVar5 = uVar5 | (ulong)((uint)POPCOUNT(pwVar2[1] & v->w64[1] ^ *pwVar1 & v->w64[0]) & 1) +
                    (ulong)((uint)POPCOUNT(pwVar3[3] & v->w64[1] ^ pwVar4[2] & v->w64[0]) & 1) * 2
                    << (uVar6 & 0x3f);
  }
  c->w64[0] = 0;
  c->w64[1] = uVar5;
  return;
}

Assistant:

void mzd_mul_v_parity_uint64_128_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);

  word res = 0;
  for (unsigned int i = 15; i; --i) {
    const block_t* Ablock = CONST_BLOCK(At, 15 - i);
    const word parity1 =
        parity64_uint64((vblock->w64[0] & Ablock->w64[0]) ^ (vblock->w64[1] & Ablock->w64[1]));
    const word parity2 =
        parity64_uint64((vblock->w64[0] & Ablock->w64[2]) ^ (vblock->w64[1] & Ablock->w64[3]));
    res |= (parity1 | (parity2 << 1)) << (64 - (2 * i));
  }
  cblock->w64[0] = 0;
  cblock->w64[1] = res;
}